

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.cpp
# Opt level: O1

QByteArray *
QtDebugUtils::toPrintable
          (QByteArray *__return_storage_ptr__,char *data,qint64 len,qsizetype maxSize)

{
  byte ch;
  uint uVar1;
  size_t sVar2;
  char *pcVar3;
  qint64 qVar4;
  long lVar5;
  long in_FS_OFFSET;
  QByteArrayView data_00;
  QByteArrayView data_01;
  QByteArrayView data_02;
  undefined2 local_40;
  char cStack_3e;
  char cStack_3d;
  undefined1 local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (data == (char *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QByteArray::QByteArray(__return_storage_ptr__,"(null)",-1);
      return __return_storage_ptr__;
    }
  }
  else {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char *)0x0;
    (__return_storage_ptr__->d).size = 0;
    qVar4 = maxSize;
    if (len < maxSize) {
      qVar4 = len;
    }
    if (0 < qVar4) {
      lVar5 = 0;
      do {
        ch = data[lVar5];
        uVar1 = (uint)ch;
        if ((int)(char)ch - 0x7fU < 0xffffffa1) {
          if (uVar1 == 9) {
            pcVar3 = "\\t";
          }
          else {
            pcVar3 = "\\n";
            if (uVar1 != 10) {
              if (uVar1 != 0xd) {
                _local_40 = CONCAT13("0123456789abcdef"[uVar1 & 0xf],
                                     CONCAT12("0123456789abcdef"[ch >> 4],0x785c));
                local_3c = 0;
                sVar2 = strlen((char *)&local_40);
                data_01.m_data = (storage_type *)&local_40;
                data_01.m_size = sVar2;
                QByteArray::insert(__return_storage_ptr__,(__return_storage_ptr__->d).size,data_01);
                goto LAB_0022309e;
              }
              pcVar3 = "\\r";
            }
          }
          data_00.m_data = pcVar3;
          data_00.m_size = 2;
          QByteArray::insert(__return_storage_ptr__,(__return_storage_ptr__->d).size,data_00);
        }
        else {
          QByteArray::append(__return_storage_ptr__,ch);
        }
LAB_0022309e:
        lVar5 = lVar5 + 1;
      } while (qVar4 != lVar5);
    }
    if (maxSize < len) {
      data_02.m_data = "...";
      data_02.m_size = 3;
      QByteArray::insert(__return_storage_ptr__,(__return_storage_ptr__->d).size,data_02);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

QByteArray QtDebugUtils::toPrintable(const char *data, qint64 len, qsizetype maxSize)
{
    if (!data)
        return "(null)";

    QByteArray out;
    for (qsizetype i = 0; i < qMin(len, maxSize); ++i) {
        char c = data[i];
        if (isAsciiPrintable(c)) {
            out += c;
        } else {
            switch (c) {
            case '\n':
                out += "\\n";
                break;
            case '\r':
                out += "\\r";
                break;
            case '\t':
                out += "\\t";
                break;
            default: {
                const char buf[] = {
                    '\\',
                    'x',
                    toHexLower(uchar(c) / 16),
                    toHexLower(uchar(c) % 16),
                    0
                };
                out += buf;
            }
            }
        }
    }

    if (maxSize < len)
        out += "...";

    return out;
}